

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QTzTransition>::reallocateAndGrow
          (QArrayDataPointer<QTzTransition> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTzTransition> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QTzTransition *pQVar3;
  undefined1 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QTzTransition> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QTzTransition> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QPodArrayOps<QTzTransition>::reallocate
                ((QPodArrayOps<QTzTransition> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QTzTransition *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if ((this->size != 0) && (lVar5 = this->size + (n >> 0x3f & n), lVar5 != 0)) {
        memcpy(local_48.ptr + local_48.size,this->ptr,lVar5 * 0x10);
        local_48.size = local_48.size + lVar5;
      }
      pQVar2 = &this->d->super_QArrayData;
      pQVar3 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar4 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = (Data *)pQVar2;
      local_48.ptr = pQVar3;
      local_48.size = (qsizetype)puVar4;
      if (old != (QArrayDataPointer<QTzTransition> *)0x0) {
        local_48.d = old->d;
        old->d = (Data *)pQVar2;
        local_48.ptr = old->ptr;
        old->ptr = pQVar3;
        local_48.size = old->size;
        old->size = (qsizetype)puVar4;
      }
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x10,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }